

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser.c++
# Opt level: O1

ParsedSchemaList * __thiscall
capnp::ParsedSchema::getAllNested(ParsedSchemaList *__return_storage_ptr__,ParsedSchema *this)

{
  RawBrandedSchema *pRVar1;
  SchemaParser *pSVar2;
  Reader local_70;
  PointerReader local_40;
  
  pRVar1 = (this->super_Schema).raw;
  pSVar2 = this->parser;
  Schema::getProto(&local_70,&this->super_Schema);
  if (local_70._reader.pointerCount < 2) {
    local_70._reader.nestingLimit = 0x7fffffff;
    local_70._reader.capTable = (CapTableReader *)0x0;
    local_40.pointer = (WirePointer *)0x0;
    local_70._reader.segment = (SegmentReader *)0x0;
  }
  else {
    local_40.pointer = local_70._reader.pointers + 1;
  }
  local_40.segment = local_70._reader.segment;
  local_40.capTable = local_70._reader.capTable;
  local_40.nestingLimit = local_70._reader.nestingLimit;
  capnp::_::PointerReader::getList
            (&(__return_storage_ptr__->list).reader,&local_40,INLINE_COMPOSITE,(word *)0x0);
  (__return_storage_ptr__->parent).super_Schema.raw = pRVar1;
  (__return_storage_ptr__->parent).parser = pSVar2;
  return __return_storage_ptr__;
}

Assistant:

ParsedSchema::ParsedSchemaList ParsedSchema::getAllNested() const {
  return ParsedSchemaList(*this, getProto().getNestedNodes());
}